

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileURL.cpp
# Opt level: O2

void __thiscall FileURL::SetURLFromString(FileURL *this,string *inURL)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  string newComponent;
  string local_50 [32];
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mPathComponents);
  this->mIsAbsolute = false;
  if (inURL->_M_string_length < 9) {
    uVar4 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&newComponent,(ulong)inURL);
    bVar1 = std::operator==(&newComponent,"file:///");
    std::__cxx11::string::~string((string *)&newComponent);
    uVar4 = 0;
    if (bVar1) {
      this->mIsAbsolute = true;
      uVar4 = 8;
    }
  }
  newComponent._M_dataplus._M_p = (pointer)&newComponent.field_2;
  newComponent._M_string_length = 0;
  newComponent.field_2._M_local_buf[0] = '\0';
  uVar2 = inURL->_M_string_length;
  while (uVar4 < uVar2) {
    lVar3 = std::__cxx11::string::find((char *)inURL,0x29b3ae);
    if (lVar3 == -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)inURL);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)inURL);
    }
    std::__cxx11::string::operator=((string *)&newComponent,local_50);
    std::__cxx11::string::~string(local_50);
    bVar1 = std::operator==(&newComponent,"..");
    if (((bVar1) &&
        ((this->mPathComponents).
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node._M_size != 0)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((this->mPathComponents).
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 1),".."), bVar1))
    {
      PopPathComponent(this);
    }
    else {
      bVar1 = std::operator!=(&newComponent,".");
      if (bVar1) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->mPathComponents,&newComponent);
      }
    }
    uVar2 = inURL->_M_string_length;
    uVar4 = lVar3 + 1U;
    if (lVar3 + 1U == 0) {
      uVar4 = uVar2;
    }
  }
  std::__cxx11::string::~string((string *)&newComponent);
  return;
}

Assistant:

void FileURL::SetURLFromString(const string& inURL)
{
	// path is expected to be either file:/ / /<folder1>/<folder2>....
	// or <folder1>/<folder2>...
    
	mPathComponents.clear();
	mIsAbsolute = false;	 
    
	string::size_type searchPosition = 0;
    
	if(inURL.size() > 8 && (inURL.substr(0,8) == "file:///"))
	{
        mIsAbsolute = true;
		searchPosition = 8; 
	}
    
	string newComponent;
	while(searchPosition < inURL.length())
	{
		string::size_type findResult = inURL.find("/",searchPosition);
		if(findResult == inURL.npos)
			newComponent = inURL.substr(searchPosition,findResult);
		else
			newComponent = inURL.substr(searchPosition,findResult-searchPosition);
        
		// with .. i'm doing some calculation already of sparing interim folders.
		// as a result if there are still ..s they will be only at the beginning of the path
		if(newComponent == ".." && mPathComponents.size() > 0 && mPathComponents.back() != "..")
			PopPathComponent();
		else if(newComponent != ".")
			PushPathComponent(newComponent);
        
		searchPosition = (findResult == inURL.npos) ? inURL.length() : findResult+1;
	}
}